

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ri_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  
  if ((hs->ssl->s3->field_0xdc & 0x10) != 0) {
    __assert_fail("!ssl->s3->initial_handshake_complete",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x331,"bool bssl::ext_ri_add_serverhello(SSL_HANDSHAKE *, CBB *)");
  }
  uVar2 = ssl_protocol_version(hs->ssl);
  bVar1 = true;
  if (uVar2 < 0x304) {
    iVar3 = CBB_add_u16(out,0xff01);
    if ((iVar3 != 0) && (iVar3 = CBB_add_u16(out,1), iVar3 != 0)) {
      iVar3 = CBB_add_u8(out,'\0');
      return iVar3 != 0;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ext_ri_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  // Renegotiation isn't supported as a server so this function should never be
  // called after the initial handshake.
  assert(!ssl->s3->initial_handshake_complete);

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_renegotiate) ||
      !CBB_add_u16(out, 1 /* length */) ||
      !CBB_add_u8(out, 0 /* empty renegotiation info */)) {
    return false;
  }

  return true;
}